

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

object_ptr __thiscall mjs::global_object::make_arguments_array(global_object *this)

{
  string *args;
  undefined8 extraout_RDX;
  long *in_RSI;
  object_ptr oVar1;
  object_ptr op;
  undefined1 auStack_48 [32];
  
  (**(code **)(*in_RSI + 0x58))(auStack_48 + 0x10);
  args = (string *)in_RSI[1];
  if ((int)in_RSI[4] < 2) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(auStack_48 + 0x10));
    mjs::object::class_name((object *)auStack_48);
  }
  else {
    (**(code **)(*in_RSI + 0x98))(auStack_48);
  }
  gc_heap::make<mjs::arguments_array_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)&stack0xffffffffffffffd8,args,(gc_heap_ptr<mjs::object> *)auStack_48);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)&stack0xffffffffffffffd8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(auStack_48 + 0x10));
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr global_object::make_arguments_array() {
    auto op = object_prototype();
    return heap().make<arguments_array_object>(language_version() >= version::es5 ? common_string("Arguments") : op->class_name(), op);
}